

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SigmoidParameter::Clear(SigmoidParameter *this)

{
  SigmoidParameter *this_local;
  
  this->engine_ = 0;
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void SigmoidParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SigmoidParameter)
  engine_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}